

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkCreateConeArray(Abc_Ntk_t *pNtk,Vec_Ptr_t *vRoots,int fUseAllCis)

{
  int *piVar1;
  void **ppvVar2;
  int iVar3;
  Abc_Ntk_t *pNtk_00;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Vec_Ptr_t *__ptr;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  long lVar9;
  Abc_Obj_t *pFanin;
  char Buffer [1000];
  char local_418 [1000];
  
  if ((pNtk->ntkType & ~ABC_NTK_NETLIST) != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk) || Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                  ,0x3b4,"Abc_Ntk_t *Abc_NtkCreateConeArray(Abc_Ntk_t *, Vec_Ptr_t *, int)");
  }
  pNtk_00 = Abc_NtkAlloc(pNtk->ntkType,pNtk->ntkFunc,1);
  sprintf(local_418,"%s_part",pNtk->pName);
  pcVar4 = Extra_UtilStrsav(local_418);
  pNtk_00->pName = pcVar4;
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    pAVar5 = Abc_AigConst1(pNtk_00);
    pAVar6 = Abc_AigConst1(pNtk);
    (pAVar6->field_6).pCopy = pAVar5;
  }
  __ptr = Abc_NtkDfsNodes(pNtk,(Abc_Obj_t **)vRoots->pArray,vRoots->nSize);
  pVVar7 = pNtk->vCis;
  if (0 < pVVar7->nSize) {
    lVar8 = 0;
    do {
      pAVar5 = (Abc_Obj_t *)pVVar7->pArray[lVar8];
      if (fUseAllCis == 0) {
        iVar3 = Abc_NodeIsTravIdCurrent(pAVar5);
        if (iVar3 != 0) goto LAB_0086a54c;
      }
      else {
LAB_0086a54c:
        pAVar6 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PI);
        (pAVar5->field_6).pCopy = pAVar6;
        pcVar4 = Abc_ObjName(pAVar5);
        Abc_ObjAssignName(pAVar6,pcVar4,(char *)0x0);
      }
      lVar8 = lVar8 + 1;
      pVVar7 = pNtk->vCis;
    } while (lVar8 < pVVar7->nSize);
  }
  if (0 < __ptr->nSize) {
    lVar8 = 0;
    do {
      pAVar5 = (Abc_Obj_t *)__ptr->pArray[lVar8];
      if (pNtk->ntkType == ABC_NTK_STRASH) {
        piVar1 = (pAVar5->vFanins).pArray;
        ppvVar2 = pAVar5->pNtk->vObjs->pArray;
        pAVar6 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,
                            (Abc_Obj_t *)
                            ((ulong)(*(uint *)&pAVar5->field_0x14 >> 10 & 1) ^
                            *(ulong *)((long)ppvVar2[*piVar1] + 0x40)),
                            (Abc_Obj_t *)
                            ((ulong)(*(uint *)&pAVar5->field_0x14 >> 0xb & 1) ^
                            *(ulong *)((long)ppvVar2[piVar1[1]] + 0x40)));
        (pAVar5->field_6).pCopy = pAVar6;
      }
      else {
        Abc_NtkDupObj(pNtk_00,pAVar5,0);
        if (0 < (pAVar5->vFanins).nSize) {
          lVar9 = 0;
          do {
            Abc_ObjAddFanin((pAVar5->field_6).pCopy,
                            *(Abc_Obj_t **)
                             ((long)pAVar5->pNtk->vObjs->pArray[(pAVar5->vFanins).pArray[lVar9]] +
                             0x40));
            lVar9 = lVar9 + 1;
          } while (lVar9 < (pAVar5->vFanins).nSize);
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < __ptr->nSize);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  if (0 < vRoots->nSize) {
    lVar8 = 0;
    do {
      pAVar5 = (Abc_Obj_t *)vRoots->pArray[lVar8];
      pAVar6 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PO);
      if ((*(uint *)&pAVar5->field_0x14 & 0xf) - 5 < 0xfffffffe) {
        pFanin = (pAVar5->field_6).pCopy;
      }
      else {
        pFanin = (Abc_Obj_t *)
                 ((ulong)(*(uint *)&pAVar5->field_0x14 >> 10 & 1) ^
                 *(ulong *)((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray] + 0x40));
      }
      Abc_ObjAddFanin(pAVar6,pFanin);
      pcVar4 = Abc_ObjName(pAVar5);
      Abc_ObjAssignName(pAVar6,pcVar4,(char *)0x0);
      lVar8 = lVar8 + 1;
    } while (lVar8 < vRoots->nSize);
  }
  iVar3 = Abc_NtkCheck(pNtk_00);
  if (iVar3 == 0) {
    fwrite("Abc_NtkCreateConeArray(): Network check has failed.\n",0x34,1,_stdout);
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkCreateConeArray( Abc_Ntk_t * pNtk, Vec_Ptr_t * vRoots, int fUseAllCis )
{
    Abc_Ntk_t * pNtkNew; 
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pFanin, * pNodeCoNew;
    char Buffer[1000];
    int i, k;

    assert( Abc_NtkIsLogic(pNtk) || Abc_NtkIsStrash(pNtk) );
    
    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    // set the name
    sprintf( Buffer, "%s_part", pNtk->pName );
    pNtkNew->pName = Extra_UtilStrsav(Buffer);

    // establish connection between the constant nodes
    if ( Abc_NtkIsStrash(pNtk) )
        Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);

    // collect the nodes in the TFI of the output (mark the TFI)
    vNodes = Abc_NtkDfsNodes( pNtk, (Abc_Obj_t **)Vec_PtrArray(vRoots), Vec_PtrSize(vRoots) );

    // create the PIs
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        if ( fUseAllCis || Abc_NodeIsTravIdCurrent(pObj) ) // TravId is set by DFS
        {
            pObj->pCopy = Abc_NtkCreatePi(pNtkNew);
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), NULL );
        }
    }

    // copy the nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        // if it is an AIG, add to the hash table
        if ( Abc_NtkIsStrash(pNtk) )
        {
            pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
        }
        else
        {
            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
        }
    }
    Vec_PtrFree( vNodes );

    // add the POs corresponding to the root nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vRoots, pObj, i )
    {
        // create the PO node
        pNodeCoNew = Abc_NtkCreatePo( pNtkNew );
        // connect the internal nodes to the new CO
        if ( Abc_ObjIsCo(pObj) )
            Abc_ObjAddFanin( pNodeCoNew, Abc_ObjChild0Copy(pObj) );
        else
            Abc_ObjAddFanin( pNodeCoNew, pObj->pCopy );
        // assign the name
        Abc_ObjAssignName( pNodeCoNew, Abc_ObjName(pObj), NULL );
    }

    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkCreateConeArray(): Network check has failed.\n" );
    return pNtkNew;
}